

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stp_bv_performance.cpp
# Opt level: O1

int main(void)

{
  TestMaterial local_a0;
  
  sch::CD_Scene::CD_Scene(&local_a0.sObj);
  local_a0.CurrentObj = 0;
  local_a0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_a0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_a0.stppObjects.super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_a0._129_8_ = 0;
  TestMaterial::initializeUniverse(&local_a0);
  TestMaterial::TestAnimation(&local_a0);
  std::vector<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>::~vector(&local_a0.stppObjects);
  sch::CD_Scene::~CD_Scene(&local_a0.sObj);
  return 0;
}

Assistant:

int main()
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif
  TestMaterial universe = TestMaterial(false); // No other objects than STP-BVs
  universe.initializeUniverse();
  universe.TestAnimation();
  return 0;
}